

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Expression * soul::operator+(Expression *__return_storage_ptr__,Expression *a,Expression *b)

{
  pointer pSVar1;
  Section *s;
  pointer pSVar2;
  
  std::
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ::reserve(&a->sections,
            ((long)(a->sections).
                   super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(a->sections).
                  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x48 +
            ((long)(b->sections).
                   super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(b->sections).
                  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  pSVar1 = (b->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar2 = (b->sections).
                super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::emplace_back<soul::SourceCodeModel::Expression::Section>(&a->sections,pSVar2);
  }
  pSVar2 = (a->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (a->sections).
       super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar2;
  (__return_storage_ptr__->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->sections).
       super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression operator+ (SourceCodeModel::Expression a, SourceCodeModel::Expression&& b)
{
    a.sections.reserve (a.sections.size() + b.sections.size());

    for (auto& s : b.sections)
        a.sections.push_back (std::move (s));

    return a;
}